

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

void __thiscall
cmMessenger::IssueMessage
          (cmMessenger *this,MessageType t,string *text,cmListFileBacktrace *backtrace)

{
  bool bVar1;
  MessageType t_00;
  MessageType override;
  bool force;
  cmListFileBacktrace *backtrace_local;
  string *text_local;
  MessageType t_local;
  cmMessenger *this_local;
  
  t_00 = ConvertMessageType(this,t);
  if ((t_00 != t) || (bVar1 = IsMessageTypeVisible(this,t), t_00 = t, bVar1)) {
    DisplayMessage(this,t_00,text,backtrace);
  }
  return;
}

Assistant:

void cmMessenger::IssueMessage(MessageType t, const std::string& text,
                               const cmListFileBacktrace& backtrace) const
{
  bool force = false;
  // override the message type, if needed, for warnings and errors
  MessageType override = this->ConvertMessageType(t);
  if (override != t) {
    t = override;
    force = true;
  }

  if (force || this->IsMessageTypeVisible(t)) {
    this->DisplayMessage(t, text, backtrace);
  }
}